

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool copyFileIfNewer(QString *sourceFileName,QString *destinationFileName,Options *options,
                    bool forceOverwrite)

{
  FILE *pFVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QFileInfo destinationFileInfo;
  QFileInfo sourceFileInfo;
  QFileInfo local_88 [8];
  QArrayData *local_80 [3];
  QString local_68;
  QDateTime local_50 [8];
  QDateTime local_48 [8];
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&dependenciesForDepfile,dependenciesForDepfile.d.size,
             sourceFileName);
  QList<QString>::end(&dependenciesForDepfile);
  cVar2 = QFile::exists(destinationFileName);
  if (cVar2 != '\0') {
    local_80[0] = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)local_80,destinationFileName);
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_40,sourceFileName);
    if (forceOverwrite) {
LAB_0010e6cf:
      bVar4 = false;
    }
    else {
      QFileInfo::fileTime((FileTime)local_48);
      QFileInfo::fileTime((FileTime)local_50);
      cVar2 = compareThreeWay(local_48,local_50);
      if ('\0' < cVar2) goto LAB_0010e6cf;
      bVar4 = alwaysOverwritableFile(destinationFileName);
      bVar4 = !bVar4;
    }
    if (!forceOverwrite) {
      QDateTime::~QDateTime(local_50);
      QDateTime::~QDateTime(local_48);
    }
    pFVar1 = _stdout;
    if (bVar4) {
      bVar3 = 1;
      if (options->verbose == true) {
        QString::toLocal8Bit_helper((QChar *)&local_68,(longlong)(sourceFileName->d).ptr);
        pcVar5 = local_68.d.ptr;
        if (local_68.d.ptr == (char16_t *)0x0) {
          pcVar5 = (char16_t *)&QByteArray::_empty;
        }
        fprintf(pFVar1,"  -- Skipping file %s. Same or newer file already in place.\n",pcVar5);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
LAB_0010e7b1:
      bVar4 = false;
    }
    else {
      QFile::QFile((QFile *)&local_68,destinationFileName);
      bVar3 = QFile::remove();
      QFile::~QFile((QFile *)&local_68);
      if (bVar3 == 0) {
        copyFileIfNewer();
        bVar3 = 0;
        goto LAB_0010e7b1;
      }
      bVar4 = true;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_40);
    QFileInfo::~QFileInfo((QFileInfo *)local_80);
    if (!bVar4) goto LAB_0010e919;
  }
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  QDir::QDir((QDir *)&local_40,&local_68);
  QFileInfo::QFileInfo(local_88,destinationFileName);
  QFileInfo::path();
  cVar2 = QDir::mkpath((QDir *)&local_40,local_80,0);
  if (local_80[0] != (QArrayData *)0x0) {
    LOCK();
    (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_80[0],2,0x10);
    }
  }
  QFileInfo::~QFileInfo(local_88);
  QDir::~QDir((QDir *)&local_40);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar2 == '\0') {
    copyFileIfNewer();
LAB_0010e953:
    bVar3 = 0;
  }
  else {
    cVar2 = QFile::exists(destinationFileName);
    if (cVar2 == '\0') {
      cVar2 = QFile::copy(sourceFileName,destinationFileName);
      if (cVar2 == '\0') {
        copyFileIfNewer();
        goto LAB_0010e953;
      }
    }
    pFVar1 = _stdout;
    bVar3 = 1;
    if (options->verbose == true) {
      QString::toLocal8Bit_helper((QChar *)&local_68,(longlong)(destinationFileName->d).ptr);
      pcVar5 = local_68.d.ptr;
      if (local_68.d.ptr == (char16_t *)0x0) {
        pcVar5 = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar1,"  -- Copied %s\n",pcVar5);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
        }
      }
      fflush(_stdout);
    }
  }
LAB_0010e919:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool copyFileIfNewer(const QString &sourceFileName,
                     const QString &destinationFileName,
                     const Options &options,
                     bool forceOverwrite = false)
{
    dependenciesForDepfile << sourceFileName;
    if (QFile::exists(destinationFileName)) {
        QFileInfo destinationFileInfo(destinationFileName);
        QFileInfo sourceFileInfo(sourceFileName);

        if (!forceOverwrite
                && sourceFileInfo.lastModified() <= destinationFileInfo.lastModified()
                && !alwaysOverwritableFile(destinationFileName)) {
            if (options.verbose)
                fprintf(stdout, "  -- Skipping file %s. Same or newer file already in place.\n", qPrintable(sourceFileName));
            return true;
        } else {
            if (!QFile(destinationFileName).remove()) {
                fprintf(stderr, "Can't remove old file: %s\n", qPrintable(destinationFileName));
                return false;
            }
        }
    }

    if (!QDir().mkpath(QFileInfo(destinationFileName).path())) {
        fprintf(stderr, "Cannot make output directory for %s.\n", qPrintable(destinationFileName));
        return false;
    }

    if (!QFile::exists(destinationFileName) && !QFile::copy(sourceFileName, destinationFileName)) {
        fprintf(stderr, "Failed to copy %s to %s.\n", qPrintable(sourceFileName), qPrintable(destinationFileName));
        return false;
    } else if (options.verbose) {
        fprintf(stdout, "  -- Copied %s\n", qPrintable(destinationFileName));
        fflush(stdout);
    }
    return true;
}